

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::attribute(xml_node *this,char_t *name_)

{
  bool bVar1;
  xml_attribute_struct *local_28;
  xml_attribute_struct *i;
  char_t *name__local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  else {
    for (local_28 = this->_root->first_attribute; local_28 != (xml_attribute_struct *)0x0;
        local_28 = local_28->next_attribute) {
      if ((local_28->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,local_28->name), bVar1)) {
        xml_attribute::xml_attribute((xml_attribute *)&this_local,local_28);
        return (xml_attribute)(xml_attribute_struct *)this_local;
      }
    }
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
  }
  return (xml_attribute)(xml_attribute_struct *)this_local;
}

Assistant:

PUGI__FN xml_attribute xml_node::attribute(const char_t* name_) const
	{
		if (!_root) return xml_attribute();

		for (xml_attribute_struct* i = _root->first_attribute; i; i = i->next_attribute)
			if (i->name && impl::strequal(name_, i->name))
				return xml_attribute(i);

		return xml_attribute();
	}